

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O0

void __thiscall
TEST_MockPlugin_checkExpectationsAndClearAtEnd_Test::testBody
          (TEST_MockPlugin_checkExpectationsAndClearAtEnd_Test *this)

{
  uint uVar1;
  MockSupport *pMVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  SimpleString *this_00;
  char *pcVar5;
  TestTerminator *pTVar6;
  SimpleString local_f0;
  undefined1 local_e0 [56];
  MockExpectedCallsDidntHappenFailure expectedFailure;
  undefined1 local_28 [8];
  MockExpectedCallsListForTest expectations;
  MockFailureReporterInstaller failureReporterInstaller;
  TEST_MockPlugin_checkExpectationsAndClearAtEnd_Test *this_local;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&expectations.super_MockExpectedCallsList.head_ + 7));
  MockExpectedCallsListForTest::MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_28);
  SimpleString::SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_,"foobar");
  MockExpectedCallsListForTest::addFunction
            ((MockExpectedCallsListForTest *)local_28,
             (SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  SimpleString::~SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  MockExpectedCallsDidntHappenFailure::MockExpectedCallsDidntHappenFailure
            ((MockExpectedCallsDidntHappenFailure *)(local_e0 + 0x30),
             (this->super_TEST_GROUP_CppUTestGroupMockPlugin).test,(MockExpectedCallsList *)local_28
            );
  SimpleString::SimpleString((SimpleString *)(local_e0 + 0x20),"");
  pMVar2 = mock((SimpleString *)(local_e0 + 0x20),(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)(local_e0 + 0x10),"foobar");
  (*pMVar2->_vptr_MockSupport[3])(pMVar2,local_e0 + 0x10);
  SimpleString::~SimpleString((SimpleString *)(local_e0 + 0x10));
  SimpleString::~SimpleString((SimpleString *)(local_e0 + 0x20));
  MockSupportPlugin::postTestAction
            (&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin,
             (this->super_TEST_GROUP_CppUTestGroupMockPlugin).test,
             (this->super_TEST_GROUP_CppUTestGroupMockPlugin).result);
  pUVar3 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_e0);
  pcVar4 = SimpleString::asCharString((SimpleString *)local_e0);
  this_00 = StringBufferTestOutput::getOutput
                      (&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).output);
  pcVar5 = SimpleString::asCharString(this_00);
  (*pUVar3->_vptr_UtestShell[0xc])
            (pUVar3,pcVar4,pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockPluginTest.cpp"
             ,0x46);
  SimpleString::~SimpleString((SimpleString *)local_e0);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_f0,"");
  pMVar2 = mock(&local_f0,(MockFailureReporter *)0x0);
  uVar1 = (*pMVar2->_vptr_MockSupport[0x26])();
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,0,(ulong)(uVar1 & 1),"LONGS_EQUAL(0, mock().expectedCallsLeft()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockPluginTest.cpp"
             ,0x47,pTVar6);
  SimpleString::~SimpleString(&local_f0);
  CHECK_NO_MOCK_FAILURE_LOCATION
            ("/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockPluginTest.cpp"
             ,0x48);
  MockExpectedCallsDidntHappenFailure::~MockExpectedCallsDidntHappenFailure
            ((MockExpectedCallsDidntHappenFailure *)(local_e0 + 0x30));
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_28);
  MockFailureReporterInstaller::~MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&expectations.super_MockExpectedCallsList.head_ + 7));
  return;
}

Assistant:

TEST(MockPlugin, checkExpectationsAndClearAtEnd)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foobar");
    MockExpectedCallsDidntHappenFailure expectedFailure(test, expectations);

    mock().expectOneCall("foobar");

    plugin.postTestAction(*test, *result);

    STRCMP_CONTAINS(expectedFailure.getMessage().asCharString(), output.getOutput().asCharString());
    LONGS_EQUAL(0, mock().expectedCallsLeft());
    CHECK_NO_MOCK_FAILURE();
}